

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::float16Check(TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  char *local_48;
  char *extensions [3];
  bool builtIn_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  if (!builtIn) {
    local_48 = "GL_AMD_gpu_shader_half_float";
    extensions[0] = "GL_EXT_shader_explicit_arithmetic_types";
    extensions[1] = "GL_EXT_shader_explicit_arithmetic_types_float16";
    (*this->_vptr_TParseVersions[5])(this,loc,3,&local_48,op);
  }
  return;
}

Assistant:

void TParseVersions::float16Check(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (!builtIn) {
        const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_half_float,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_float16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}